

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CluHasVar(word *t,int nVars,int iVar)

{
  ulong *puVar1;
  word *pwVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar6 = 1;
  uVar9 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar9 = uVar6;
  }
  if (iVar < nVars) {
    if (iVar < 6) {
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      uVar11 = 0;
      do {
        if (uVar9 == uVar11) {
          return 0;
        }
        puVar1 = t + uVar11;
        uVar11 = uVar11 + 1;
      } while ((~Truth6[iVar] & *puVar1) ==
               (Truth6[iVar] & *puVar1) >> ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f));
    }
    else {
      bVar7 = (byte)iVar - 6;
      bVar3 = bVar7 & 0x1f;
      uVar5 = 1 << bVar3;
      iVar8 = 2 << (bVar7 & 0x1f);
      uVar6 = 0 << bVar3;
      uVar11 = 0;
      if (0 < (int)uVar5) {
        uVar11 = (ulong)uVar5;
      }
      for (iVar10 = 0; iVar10 < (int)uVar9; iVar10 = iVar10 + iVar8) {
        uVar12 = 0;
        while (uVar11 != uVar12) {
          pwVar2 = t + uVar12;
          lVar4 = (long)(int)uVar5 + uVar12;
          uVar12 = uVar12 + 1;
          if (*pwVar2 != t[lVar4]) {
            return 1;
          }
        }
        t = t + iVar8;
      }
    }
    return uVar6;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x5c1,"int If_CluHasVar(word *, int, int)");
}

Assistant:

static inline int If_CluHasVar( word * t, int nVars, int iVar )
{
    int nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            if ( (t[i] & ~Truth6[iVar]) != ((t[i] & Truth6[iVar]) >> Shift) )
                return 1;
        return 0;
    }
    else
    {
        int i, k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                if ( t[i] != t[Step+i] )
                    return 1;
            t += 2*Step;
        }
        return 0;
    }
}